

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::Configuration::save
          (Configuration *this,ostream *out,string *eol,ConfigurationGroup *group,string *fullPath)

{
  string *psVar1;
  bool bVar2;
  Configuration *pCVar3;
  ostream *output;
  char *pcVar4;
  Group *pGVar5;
  ulong uVar6;
  reference __lhs;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  string name;
  Group *g;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  size_t pos;
  string valueString;
  Value *value;
  iterator __end2;
  iterator __begin2;
  vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
  *__range2;
  string buffer;
  Flags local_59;
  Error local_58;
  string *local_30;
  string *fullPath_local;
  ConfigurationGroup *group_local;
  string *eol_local;
  ostream *out_local;
  Configuration *this_local;
  
  local_30 = fullPath;
  fullPath_local = (string *)group;
  group_local = (ConfigurationGroup *)eol;
  eol_local = (string *)out;
  out_local = (ostream *)this;
  pCVar3 = ConfigurationGroup::configuration(group);
  if (pCVar3 != this) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error(&local_58,output,local_59);
    Debug::operator<<(&local_58.super_Debug,
                      "Assertion group->configuration() == this failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:312"
                     );
    Error::~Error(&local_58);
    abort();
  }
  std::__cxx11::string::string((string *)&__range2);
  psVar1 = fullPath_local;
  __end2 = std::
           vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
           ::begin((vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                    *)fullPath_local);
  value = (Value *)std::
                   vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                   ::end((vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                          *)psVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
                                     *)&value), bVar2) {
    valueString.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
         ::operator*(&__end2);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      lVar7 = std::__cxx11::string::find_first_of((char)valueString.field_2._8_8_ + ' ',10);
      if (lVar7 == -1) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          pcVar4 = (char *)std::__cxx11::string::front();
          bVar2 = anon_unknown_0::isWhitespace(*pcVar4);
          if (!bVar2) {
            pcVar4 = (char *)std::__cxx11::string::back();
            bVar2 = anon_unknown_0::isWhitespace(*pcVar4);
            if (!bVar2) goto LAB_001ad05a;
          }
          std::operator+(&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         valueString.field_2._8_8_,"=\"");
          std::operator+(&local_1f8,&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (valueString.field_2._8_8_ + 0x20));
          std::operator+(&local_1d8,&local_1f8,'\"');
          std::operator+(&local_1b8,&local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         group_local);
          std::__cxx11::string::operator=((string *)&__range2,(string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
        }
        else {
LAB_001ad05a:
          std::operator+(&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         valueString.field_2._8_8_,'=');
          std::operator+(&local_258,&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (valueString.field_2._8_8_ + 0x20));
          std::operator+(&local_238,&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         group_local);
          std::__cxx11::string::operator=((string *)&__range2,(string *)&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
        }
      }
      else {
        std::__cxx11::string::string((string *)&pos,(string *)(valueString.field_2._8_8_ + 0x20));
        local_d8 = 0;
        while (local_d8 = std::__cxx11::string::find_first_of((char)&pos,10),
              local_d8 != 0xffffffffffffffff) {
          std::__cxx11::string::replace((ulong)&pos,local_d8,(string *)0x1);
          lVar7 = std::__cxx11::string::size();
          local_d8 = lVar7 + local_d8;
        }
        std::operator+(&local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       valueString.field_2._8_8_,"=\"\"\"");
        std::operator+(&local_178,&local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       group_local);
        std::operator+(&local_158,&local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
        std::operator+(&local_138,&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       group_local);
        std::operator+(&local_118,&local_138,"\"\"\"");
        std::operator+(&local_f8,&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       group_local);
        std::__cxx11::string::operator=((string *)&__range2,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&pos);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (valueString.field_2._8_8_ + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     group_local);
      std::__cxx11::string::operator=((string *)&__range2,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
    psVar1 = eol_local;
    lVar7 = std::__cxx11::string::data();
    std::__cxx11::string::size();
    std::ostream::write((char *)psVar1,lVar7);
    __gnu_cxx::
    __normal_iterator<Corrade::Utility::ConfigurationGroup::Value_*,_std::vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>_>
    ::operator++(&__end2);
  }
  g = (Group *)0x0;
  do {
    pGVar5 = (Group *)std::
                      vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                      ::size((vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                              *)((long)&fullPath_local->field_2 + 8));
    if (g == pGVar5) {
      std::__cxx11::string::~string((string *)&__range2);
      return;
    }
    name.field_2._8_8_ =
         std::
         vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
         ::operator[]((vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                       *)((long)&fullPath_local->field_2 + 8),(size_type)g);
    std::__cxx11::string::string((string *)local_2c8,(string *)name.field_2._8_8_);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::operator+(&local_308,local_30,'/');
      std::operator+(&local_2e8,&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8)
      ;
      std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
    }
    if (g == (Group *)0x0) {
LAB_001ad2f8:
      bVar2 = std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::empty(*(vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                        **)(name.field_2._8_8_ + 0x20));
      if ((!bVar2) ||
         (bVar2 = std::
                  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                  ::empty((vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                           *)(*(long *)(name.field_2._8_8_ + 0x20) + 0x18)), bVar2))
      goto LAB_001ad32b;
    }
    else {
      __lhs = std::
              vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
              ::operator[]((vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                            *)((long)&fullPath_local->field_2 + 8),
                           (size_type)((long)&g[-1].group + 7));
      bVar2 = std::operator!=(&__lhs->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              name.field_2._8_8_);
      if (bVar2) goto LAB_001ad2f8;
LAB_001ad32b:
      std::operator+(&local_368,'[',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8)
      ;
      std::operator+(&local_348,&local_368,']');
      std::operator+(&local_328,&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     group_local);
      std::__cxx11::string::operator=((string *)&__range2,(string *)&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      psVar1 = eol_local;
      lVar7 = std::__cxx11::string::data();
      std::__cxx11::string::size();
      std::ostream::write((char *)psVar1,lVar7);
    }
    save(this,(ostream *)eol_local,(string *)group_local,
         *(ConfigurationGroup **)(name.field_2._8_8_ + 0x20),(string *)local_2c8);
    std::__cxx11::string::~string((string *)local_2c8);
    g = (Group *)&(g->name).field_0x1;
  } while( true );
}

Assistant:

void Configuration::save(std::ostream& out, const std::string& eol, ConfigurationGroup* group, const std::string& fullPath) const {
    CORRADE_INTERNAL_ASSERT(group->configuration() == this);
    std::string buffer;

    /* Foreach all items in the group */
    for(const Value& value: group->_values) {
        /* Key/value pair */
        if(!value.key.empty()) {
            /* Multi-line value */
            if(value.value.find_first_of('\n') != std::string::npos) {
                /* Replace \n with `eol` */
                /** @todo fixme: ugly and slow */
                std::string valueString = value.value;
                std::size_t pos = 0;
                while((pos = valueString.find_first_of('\n', pos)) != std::string::npos) {
                    valueString.replace(pos, 1, eol);
                    pos += eol.size();
                }

                buffer = value.key + "=\"\"\"" + eol + valueString + eol + "\"\"\"" + eol;

            /* Value with leading/trailing spaces */
            } else if(!value.value.empty() && (isWhitespace(value.value.front()) || isWhitespace(value.value.back()))) {
                buffer = value.key + "=\"" + value.value + '"' + eol;

            /* Value without spaces */
            } else buffer = value.key + '=' + value.value + eol;
        }

        /* Comment / empty line */
        else buffer = value.value + eol;

        out.write(buffer.data(), buffer.size());
    }

    /* Recursively process all subgroups */
    for(std::size_t i = 0; i != group->_groups.size(); ++i) {
        const Group& g = group->_groups[i];

        /* Subgroup name */
        std::string name = g.name;
        if(!fullPath.empty()) name = fullPath + '/' + name;

        /* Omit the name if the group is a first subgroup of given name, has no
           values and only subgroups */
        if(!((i == 0 || group->_groups[i - 1].name != g.name) && g.group->_values.empty() && !g.group->_groups.empty())) {
            buffer = '[' + name + ']' + eol;
            out.write(buffer.data(), buffer.size());
        }

        save(out, eol, g.group, name);
    }
}